

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPrivate::addField(QWizardPrivate *this,QWizardField *field)

{
  bool bVar1;
  QWizard *pQVar2;
  undefined8 uVar3;
  qsizetype qVar4;
  QObject *pQVar5;
  QWizardPrivate *in_RDI;
  long in_FS_OFFSET;
  QWizard *q;
  QWizardField myField;
  parameter_type in_stack_fffffffffffffef8;
  char *pcVar6;
  QWizardField *in_stack_ffffffffffffff00;
  QString *in_stack_ffffffffffffff08;
  QString *key;
  QWizardField *in_stack_ffffffffffffff18;
  Connection local_c0;
  Connection local_b8;
  undefined4 local_ac;
  char local_a8 [32];
  char *local_88;
  QString QStack_80;
  byte local_68;
  char *local_60;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  memset(&local_88,0xaa,0x80);
  QWizardField::QWizardField(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  QWizardField::resolve(in_stack_ffffffffffffff18,(QList<QWizardDefaultProperty> *)in_RDI);
  bVar1 = QMap<QString,_int>::contains((QMap<QString,_int> *)in_RDI,in_stack_ffffffffffffff08);
  if (bVar1) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,(char *)in_stack_ffffffffffffff08,
               (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),(char *)in_stack_fffffffffffffef8);
    QtPrivate::asString(&QStack_80);
    uVar3 = QString::utf16();
    QMessageLogger::warning(local_a8,"QWizardPage::addField: Duplicate field \'%ls\'",uVar3);
  }
  else {
    in_stack_ffffffffffffff00 = (QWizardField *)&in_RDI->fieldIndexMap;
    key = &QStack_80;
    qVar4 = QList<QWizardField>::size(&in_RDI->fields);
    local_ac = (undefined4)qVar4;
    QMap<QString,_int>::insert((QMap<QString,_int> *)in_RDI,key,(int *)in_stack_ffffffffffffff00);
    QList<QWizardField>::operator+=
              ((QList<QWizardField> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    if ((local_68 & 1) != 0) {
      bVar1 = QByteArray::isEmpty((QByteArray *)0x7b53b3);
      if (!bVar1) {
        pcVar6 = local_60;
        pQVar5 = (QObject *)QByteArray::operator_cast_to_char_((QByteArray *)0x7b53d4);
        QObject::connect((QObject *)&local_b8,pcVar6,pQVar5,local_88,0xb33763);
        QMetaObject::Connection::~Connection(&local_b8);
      }
    }
    QObject::connect((QObject *)&local_c0,local_60,(QObject *)"2destroyed(QObject*)",(char *)pQVar2,
                     0xb33782);
    QMetaObject::Connection::~Connection(&local_c0);
  }
  QWizardField::~QWizardField(in_stack_ffffffffffffff00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::addField(const QWizardField &field)
{
    Q_Q(QWizard);

    QWizardField myField = field;
    myField.resolve(defaultPropertyTable);

    if (Q_UNLIKELY(fieldIndexMap.contains(myField.name))) {
        qWarning("QWizardPage::addField: Duplicate field '%ls'", qUtf16Printable(myField.name));
        return;
    }

    fieldIndexMap.insert(myField.name, fields.size());
    fields += myField;
    if (myField.mandatory && !myField.changedSignal.isEmpty())
        QObject::connect(myField.object, myField.changedSignal,
                         myField.page, SLOT(_q_maybeEmitCompleteChanged()));
    QObject::connect(
        myField.object, SIGNAL(destroyed(QObject*)), q,
        SLOT(_q_handleFieldObjectDestroyed(QObject*)));
}